

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_list.cpp
# Opt level: O0

bool __thiscall
duckdb::LogicalDependencyEquality::operator()
          (LogicalDependencyEquality *this,LogicalDependency *a,LogicalDependency *b)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Alloc_hider *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  bool local_1;
  
  if (*in_RSI == in_RDX->_M_dataplus) {
    bVar1 = ::std::operator!=<char,_std::char_traits<char>,_std::allocator<char>_>
                      (in_RDX,in_stack_ffffffffffffffd8);
    if (bVar1) {
      local_1 = false;
    }
    else {
      bVar1 = ::std::operator!=<char,_std::char_traits<char>,_std::allocator<char>_>
                        (in_RDX,in_stack_ffffffffffffffd8);
      if (bVar1) {
        local_1 = false;
      }
      else {
        bVar1 = ::std::operator!=<char,_std::char_traits<char>,_std::allocator<char>_>
                          (in_RDX,in_stack_ffffffffffffffd8);
        if (bVar1) {
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool LogicalDependencyEquality::operator()(const LogicalDependency &a, const LogicalDependency &b) const {
	if (a.entry.type != b.entry.type) {
		return false;
	}
	if (a.entry.name != b.entry.name) {
		return false;
	}
	if (a.entry.schema != b.entry.schema) {
		return false;
	}
	if (a.catalog != b.catalog) {
		return false;
	}
	return true;
}